

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O2

void __thiscall eglu::anon_unknown_1::RenderContext::~RenderContext(RenderContext *this)

{
  ~RenderContext(this);
  operator_delete(this,0x1ad8);
  return;
}

Assistant:

RenderContext::~RenderContext(void)
{
	try
	{
		destroy();
	}
	catch (...)
	{
		// destroy() calls EGL functions that are checked and may throw exceptions
	}

	delete m_window;
	delete m_pixmap;
	delete m_display;
	delete m_dynamicGLLibrary;
}